

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall
Js::ParseableFunctionInfo::SetSourceInfo(ParseableFunctionInfo *this,uint sourceIndex)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  bVar1 = (this->super_FunctionProxy).field_0x47;
  if ((char)bVar1 < '\0') {
    if (this->m_sourceIndex != sourceIndex) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xbbf,"(this->m_sourceIndex == sourceIndex)",
                                  "Mismatched source index");
      if (!bVar3) {
LAB_0076e278:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
  }
  else {
    this->m_sourceIndex = sourceIndex;
    this->m_cchStartOffset = 0;
    this->m_cchLength = 0;
    this->m_columnNumber = 0;
    this->m_cbStartOffset = 0;
    this->m_lineNumber = 0;
    this->m_cbLength = 0;
    (this->super_FunctionProxy).field_0x47 = bVar1 | 0x80;
    bVar3 = FunctionProxy::IsFunctionBody(&this->super_FunctionProxy);
    if (bVar3) {
      bVar3 = FunctionProxy::IsFunctionBody(&this->super_FunctionProxy);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
        if (!bVar3) goto LAB_0076e278;
        *puVar4 = 0;
      }
      Utf8SourceInfo::SetFunctionBody
                ((this->super_FunctionProxy).m_utf8SourceInfo.ptr,(FunctionBody *)this);
      return;
    }
  }
  return;
}

Assistant:

void ParseableFunctionInfo::SetSourceInfo(uint sourceIndex)
    {
        // TODO (michhol): how do we want to handle wasm source?
        if (!m_utf8SourceHasBeenSet)
        {
            this->m_sourceIndex = sourceIndex;
            this->m_cchStartOffset = 0;
            this->m_cchLength = 0;
            this->m_lineNumber = 0;
            this->m_columnNumber = 0;

            this->m_cbStartOffset = 0;
            this->m_cbLength = 0;

            this->m_utf8SourceHasBeenSet = true;

            if (this->IsFunctionBody())
            {
                this->GetFunctionBody()->FinishSourceInfo();
            }
        }
#if DBG
        else
        {
            AssertMsg(this->m_sourceIndex == sourceIndex, "Mismatched source index");
        }
#endif
    }